

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool get_by_hash(storage *st,string *hash)

{
  undefined1 local_98 [8];
  block b;
  bool ok;
  string *hash_local;
  storage *st_local;
  
  b._111_1_ = 0;
  storage::get((block *)local_98,st,(bool *)&b.field_0x6f,hash);
  if ((b._111_1_ & 1) == 0) {
    st_local._7_1_ = (bool)(b._111_1_ & 1);
  }
  else {
    dump((ostream *)&std::cout,(block *)local_98);
    st_local._7_1_ = true;
  }
  block::~block((block *)local_98);
  return st_local._7_1_;
}

Assistant:

bool get_by_hash(storage &st, const std::string &hash) {
    bool ok{};
    block b = st.get(&ok, hash);
    if ( !ok ) {
        return ok;
    }

    dump(std::cout, b);

    return true;
}